

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFileImpl
          (DescriptorBuilder *this,FileDescriptorProto *proto)

{
  long lVar1;
  void *__s;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int32 iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  SourceCodeInfo *pSVar13;
  FileDescriptorTables *pFVar14;
  ulong uVar15;
  string *psVar16;
  FileDescriptor **ppFVar17;
  Arena *pAVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar19;
  int *piVar20;
  FileDescriptorProto *this_00;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar21;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar22;
  int i_9;
  iterator iter;
  OptionInterpreter option_interpreter;
  int i_8;
  int i_7;
  int i_6;
  int i_5;
  int index_1;
  int i_4;
  int weak_dependency_count;
  int i_3;
  int index;
  int i_2;
  int public_dependency_count;
  FileDescriptor *dependency;
  int i_1;
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> weak_deps;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen_dependencies;
  SourceCodeInfo *info;
  FileDescriptor *result;
  EnumDescriptor *in_stack_00000558;
  Descriptor *in_stack_00000560;
  EnumDescriptorProto *in_stack_00000568;
  DescriptorBuilder *in_stack_00000570;
  Descriptor *in_stack_00000c58;
  Descriptor *in_stack_00000c60;
  DescriptorProto *in_stack_00000c68;
  DescriptorBuilder *in_stack_00000c70;
  DescriptorProto *in_stack_fffffffffffffac8;
  Tables *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffadc;
  Tables *in_stack_fffffffffffffae0;
  undefined7 in_stack_fffffffffffffae8;
  undefined1 in_stack_fffffffffffffaef;
  Tables *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffafc;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  FileDescriptorProto *in_stack_fffffffffffffb20;
  int iVar23;
  undefined4 in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb34;
  DescriptorBuilder *in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb40;
  int iVar24;
  undefined4 in_stack_fffffffffffffb44;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  DescriptorBuilder *in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffb94;
  FileDescriptorProto *in_stack_fffffffffffffb98;
  DescriptorBuilder *in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffba8;
  ErrorLocation location;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  int32 iVar25;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  Message *in_stack_fffffffffffffc30;
  string *in_stack_fffffffffffffc38;
  DescriptorBuilder *in_stack_fffffffffffffc40;
  bool local_3aa;
  bool local_3a9;
  SourceCodeInfo *in_stack_fffffffffffffc58;
  OptionInterpreter *in_stack_fffffffffffffc60;
  int local_294;
  __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
  local_288 [6];
  OptionsToInterpret *in_stack_fffffffffffffda8;
  OptionInterpreter *in_stack_fffffffffffffdb0;
  DescriptorProto *in_stack_fffffffffffffe20;
  Descriptor *in_stack_fffffffffffffe28;
  DescriptorBuilder *in_stack_fffffffffffffe30;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_190;
  int local_18c;
  _Self local_178;
  _Self local_170;
  _Self local_168;
  _Self local_160;
  undefined4 local_154;
  SourceCodeInfo *local_150;
  _Base_ptr local_148;
  byte local_140;
  _Base_ptr local_138;
  byte local_130;
  int local_124;
  _Base_ptr local_120;
  undefined1 local_118;
  int32 local_110;
  int local_10c;
  allocator local_a1;
  string local_a0 [32];
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  SourceCodeInfo *local_28;
  SourceCodeInfo *local_20;
  SourceCodeInfo *local_8;
  
  location = (ErrorLocation)((ulong)in_stack_fffffffffffffba8 >> 0x20);
  local_20 = (SourceCodeInfo *)
             DescriptorPool::Tables::Allocate<google::protobuf::FileDescriptor>((Tables *)0x4bdd10);
  in_RDI[0xb] = (long)local_20;
  *(undefined1 *)((long)(local_20 + 1) + 0x10) = 0;
  *(undefined1 *)((long)(local_20 + 1) + 0x11) = 0;
  local_28 = (SourceCodeInfo *)0x0;
  bVar2 = FileDescriptorProto::has_source_code_info((FileDescriptorProto *)0x4bdd60);
  if (bVar2) {
    local_28 = DescriptorPool::Tables::AllocateMessage<google::protobuf::SourceCodeInfo>
                         (in_stack_fffffffffffffaf0,
                          (SourceCodeInfo *)
                          CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
    FileDescriptorProto::source_code_info((FileDescriptorProto *)0x4bdda0);
    SourceCodeInfo::CopyFrom
              ((SourceCodeInfo *)in_stack_fffffffffffffad0,
               (SourceCodeInfo *)in_stack_fffffffffffffac8);
    local_20[3]._internal_metadata_.
    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    .ptr_ = local_28;
  }
  else {
    pSVar13 = SourceCodeInfo::default_instance();
    local_20[3]._internal_metadata_.
    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    .ptr_ = pSVar13;
  }
  pFVar14 = DescriptorPool::Tables::AllocateFileTables(in_stack_fffffffffffffaf0);
  in_RDI[0xc] = (long)pFVar14;
  *(long *)(in_RDI[0xb] + 0x90) = in_RDI[0xc];
  bVar2 = FileDescriptorProto::has_name((FileDescriptorProto *)0x4bde1c);
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,anon_var_dwarf_29c033 + 0x11,&local_49);
    AddError(in_stack_fffffffffffffb50,
             (string *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
             (Message *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
             (ErrorLocation)((ulong)in_stack_fffffffffffffb38 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  FileDescriptorProto::syntax_abi_cxx11_((FileDescriptorProto *)0x4bdef4);
  uVar15 = std::__cxx11::string::empty();
  if ((uVar15 & 1) == 0) {
    FileDescriptorProto::syntax_abi_cxx11_((FileDescriptorProto *)0x4bdf0d);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
    if (!bVar2) {
      FileDescriptorProto::syntax_abi_cxx11_((FileDescriptorProto *)0x4bdf47);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
      if (bVar2) {
        *(undefined4 *)(in_RDI[0xb] + 0x3c) = 3;
      }
      else {
        *(undefined4 *)(in_RDI[0xb] + 0x3c) = 0;
        FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x4bdf94);
        FileDescriptorProto::syntax_abi_cxx11_((FileDescriptorProto *)0x4bdfb1);
        std::operator+((char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
        AddError((DescriptorBuilder *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 (string *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                 (Message *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),location,
                 (string *)in_stack_fffffffffffffba0);
        std::__cxx11::string::~string(local_80);
      }
      goto LAB_004be033;
    }
  }
  *(undefined4 *)(in_RDI[0xb] + 0x3c) = 2;
LAB_004be033:
  FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x4be054);
  psVar16 = DescriptorPool::Tables::AllocateString
                      (in_stack_fffffffffffffaf0,
                       (string *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
  (local_20->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)psVar16;
  bVar2 = FileDescriptorProto::has_package((FileDescriptorProto *)0x4be07f);
  if (bVar2) {
    FileDescriptorProto::package_abi_cxx11_((FileDescriptorProto *)0x4be0a6);
    psVar16 = DescriptorPool::Tables::AllocateString
                        (in_stack_fffffffffffffaf0,
                         (string *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
    (local_20->_internal_metadata_).
    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    .ptr_ = psVar16;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,anon_var_dwarf_29c033 + 0x11,&local_a1);
    psVar16 = DescriptorPool::Tables::AllocateString
                        (in_stack_fffffffffffffaf0,
                         (string *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
    (local_20->_internal_metadata_).
    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    .ptr_ = psVar16;
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  lVar1 = *in_RDI;
  local_20->_has_bits_ = (HasBits<1UL>)(int)lVar1;
  local_20->_cached_size_ = (CachedSize)(int)((ulong)lVar1 >> 0x20);
  bVar2 = DescriptorPool::Tables::AddFile
                    ((Tables *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     (FileDescriptor *)in_stack_fffffffffffffaf0);
  if (bVar2) {
    FileDescriptor::package_abi_cxx11_((FileDescriptor *)local_20);
    uVar15 = std::__cxx11::string::empty();
    if ((uVar15 & 1) == 0) {
      FileDescriptor::package_abi_cxx11_((FileDescriptor *)local_20);
      AddPackage(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                 (FileDescriptor *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x4be26a);
    iVar4 = FileDescriptorProto::dependency_size((FileDescriptorProto *)0x4be277);
    *(int *)((long)&local_20->location_ + 8) = iVar4;
    FileDescriptorProto::dependency_size((FileDescriptorProto *)0x4be2b3);
    ppFVar17 = DescriptorPool::Tables::AllocateArray<google::protobuf::FileDescriptor_const*>
                         (in_stack_fffffffffffffad0,(int)((ulong)in_stack_fffffffffffffac8 >> 0x20))
    ;
    *(FileDescriptor ***)((long)(local_20 + 1) + 0x18) = ppFVar17;
    if ((*(byte *)(*in_RDI + 0x29) & 1) == 0) {
      (local_20->location_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
      *(undefined8 *)((long)(local_20 + 1) + 0x20) = 0;
    }
    else {
      pAVar18 = (Arena *)DescriptorPool::Tables::AllocateOnceDynamic(in_stack_fffffffffffffae0);
      (local_20->location_).super_RepeatedPtrFieldBase.arena_ = pAVar18;
      FileDescriptorProto::dependency_size((FileDescriptorProto *)0x4be353);
      ppbVar19 = DescriptorPool::Tables::AllocateArray<std::__cxx11::string_const*>
                           (in_stack_fffffffffffffad0,
                            (int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)
       ((long)(local_20 + 1) + 0x20) = ppbVar19;
      iVar4 = FileDescriptorProto::dependency_size((FileDescriptorProto *)0x4be39b);
      if (0 < iVar4) {
        __s = *(void **)((long)(local_20 + 1) + 0x20);
        iVar4 = FileDescriptorProto::dependency_size((FileDescriptorProto *)0x4be3d1);
        memset(__s,0,(long)iVar4 << 3);
      }
    }
    std::
    set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             *)0x4be448);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x4be455);
    for (local_10c = 0; iVar4 = local_10c,
        iVar5 = FileDescriptorProto::weak_dependency_size((FileDescriptorProto *)0x4be47b),
        iVar4 < iVar5; local_10c = local_10c + 1) {
      local_110 = FileDescriptorProto::weak_dependency
                            ((FileDescriptorProto *)in_stack_fffffffffffffad0,
                             (int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
      pVar21 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          in_stack_fffffffffffffaf0,
                          (value_type_conflict2 *)
                          CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
      local_120 = (_Base_ptr)pVar21.first._M_node;
      local_118 = pVar21.second;
    }
    for (local_124 = 0; iVar4 = local_124,
        iVar5 = FileDescriptorProto::dependency_size((FileDescriptorProto *)0x4be55e), iVar4 < iVar5
        ; local_124 = local_124 + 1) {
      FileDescriptorProto::dependency_abi_cxx11_
                ((FileDescriptorProto *)in_stack_fffffffffffffad0,
                 (int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
      pVar22 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffaf0,
                        (value_type *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8))
      ;
      local_148 = (_Base_ptr)pVar22.first._M_node;
      local_140 = pVar22.second;
      local_138 = local_148;
      local_130 = local_140;
      if (((local_140 ^ 0xff) & 1) != 0) {
        AddTwiceListedError((DescriptorBuilder *)
                            CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                            (FileDescriptorProto *)in_stack_fffffffffffffb38,
                            in_stack_fffffffffffffb34);
      }
      FileDescriptorProto::dependency_abi_cxx11_
                ((FileDescriptorProto *)in_stack_fffffffffffffad0,
                 (int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
      local_150 = (SourceCodeInfo *)
                  DescriptorPool::Tables::FindFile
                            (in_stack_fffffffffffffae0,
                             (string *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8)
                            );
      if ((local_150 == (SourceCodeInfo *)0x0) && (*(long *)(*in_RDI + 0x18) != 0)) {
        in_stack_fffffffffffffc60 = *(OptionInterpreter **)(*in_RDI + 0x18);
        FileDescriptorProto::dependency_abi_cxx11_
                  ((FileDescriptorProto *)in_stack_fffffffffffffad0,
                   (int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
        in_stack_fffffffffffffc58 =
             (SourceCodeInfo *)
             DescriptorPool::FindFileByName
                       ((DescriptorPool *)
                        CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                        (string *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
        local_150 = in_stack_fffffffffffffc58;
      }
      if (local_150 == local_20) {
        local_8 = (SourceCodeInfo *)0x0;
        goto LAB_004bf617;
      }
      if (local_150 == (SourceCodeInfo *)0x0) {
        if ((*(byte *)(*in_RDI + 0x29) & 1) == 0) {
          local_3a9 = true;
          if ((*(byte *)(*in_RDI + 0x2a) & 1) == 0) {
            local_3aa = false;
            if ((*(byte *)(*in_RDI + 0x2b) & 1) == 0) {
              local_160._M_node =
                   (_Base_ptr)
                   std::set<int,_std::less<int>,_std::allocator<int>_>::find
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)
                              CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                              (key_type_conflict *)in_stack_fffffffffffffad0);
              local_168._M_node =
                   (_Base_ptr)
                   std::set<int,_std::less<int>,_std::allocator<int>_>::end
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)
                              in_stack_fffffffffffffac8);
              local_3aa = std::operator!=(&local_160,&local_168);
            }
            local_3a9 = local_3aa;
          }
          if (local_3a9 == false) {
            AddImportError(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                           in_stack_fffffffffffffb94);
          }
          else {
            FileDescriptorProto::dependency_abi_cxx11_
                      ((FileDescriptorProto *)in_stack_fffffffffffffad0,
                       (int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
            local_150 = (SourceCodeInfo *)
                        DescriptorPool::NewPlaceholderFileWithMutexHeld
                                  ((DescriptorPool *)in_stack_fffffffffffffae0,
                                   (string *)
                                   CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
          }
        }
      }
      else {
        bVar2 = false;
        if ((*(byte *)(*in_RDI + 0x28) & 1) != 0) {
          FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x4be8de);
          local_170._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffac8,(key_type *)0x4be8fd);
          local_178._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffac8);
          bVar3 = std::operator!=(&local_170,&local_178);
          bVar2 = false;
          if (bVar3) {
            iVar4 = FileDescriptor::public_dependency_count((FileDescriptor *)local_150);
            bVar2 = iVar4 == 0;
          }
        }
        if (bVar2) {
          std::
          set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::insert((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)in_stack_fffffffffffffaf0,
                   (value_type *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
        }
      }
      *(SourceCodeInfo **)(*(long *)((long)(local_20 + 1) + 0x18) + (long)local_124 * 8) = local_150
      ;
      if (((*(byte *)(*in_RDI + 0x29) & 1) != 0) && (local_150 == (SourceCodeInfo *)0x0)) {
        FileDescriptorProto::dependency_abi_cxx11_
                  ((FileDescriptorProto *)in_stack_fffffffffffffad0,
                   (int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
        psVar16 = DescriptorPool::Tables::AllocateString
                            (in_stack_fffffffffffffaf0,
                             (string *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8)
                            );
        *(string **)(*(long *)((long)(local_20 + 1) + 0x20) + (long)local_124 * 8) = psVar16;
      }
    }
    local_18c = 0;
    FileDescriptorProto::public_dependency_size((FileDescriptorProto *)0x4beacf);
    piVar20 = DescriptorPool::Tables::AllocateArray<int>
                        (in_stack_fffffffffffffad0,(int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
    *(int **)((long)(local_20 + 1) + 0x28) = piVar20;
    local_190 = 0;
    while (iVar4 = local_190,
          iVar5 = FileDescriptorProto::public_dependency_size((FileDescriptorProto *)0x4beb30),
          iVar4 < iVar5) {
      iVar6 = FileDescriptorProto::public_dependency
                        ((FileDescriptorProto *)in_stack_fffffffffffffad0,
                         (int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
      if ((iVar6 < 0) ||
         (iVar25 = iVar6,
         iVar4 = FileDescriptorProto::dependency_size((FileDescriptorProto *)0x4beba3),
         iVar4 <= iVar25)) {
        in_stack_fffffffffffffb98 =
             (FileDescriptorProto *)
             FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x4bec6b);
        AddError(in_stack_fffffffffffffb50,
                 (string *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                 (Message *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 (ErrorLocation)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      }
      else {
        iVar4 = local_18c + 1;
        *(int32 *)(*(long *)((long)(local_20 + 1) + 0x28) + (long)local_18c * 4) = iVar6;
        local_18c = iVar4;
        if ((*(byte *)(*in_RDI + 0x29) & 1) == 0) {
          in_stack_fffffffffffffba0 = (DescriptorBuilder *)(in_RDI + 0x13);
          FileDescriptor::dependency
                    ((FileDescriptor *)in_stack_fffffffffffffae0,in_stack_fffffffffffffadc);
          std::
          set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::erase((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)in_stack_fffffffffffffad0,(key_type *)in_stack_fffffffffffffac8);
        }
      }
      local_190 = local_190 + 1;
    }
    *(int *)((long)&local_20->location_ + 0xc) = local_18c;
    std::
    set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             *)0x4becdd);
    if ((*(byte *)(*in_RDI + 0x29) & 1) == 0) {
      local_1a4 = 0;
      while (in_stack_fffffffffffffb90 = local_1a4,
            in_stack_fffffffffffffb94 = FileDescriptor::dependency_count((FileDescriptor *)local_20)
            , in_stack_fffffffffffffb90 < in_stack_fffffffffffffb94) {
        FileDescriptor::dependency
                  ((FileDescriptor *)in_stack_fffffffffffffae0,in_stack_fffffffffffffadc);
        RecordPublicDependencies
                  ((DescriptorBuilder *)
                   CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                   (FileDescriptor *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        local_1a4 = local_1a4 + 1;
      }
    }
    local_1a8 = 0;
    FileDescriptorProto::weak_dependency_size((FileDescriptorProto *)0x4bedab);
    piVar20 = DescriptorPool::Tables::AllocateArray<int>
                        (in_stack_fffffffffffffad0,(int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
    *(int **)(local_20 + 2) = piVar20;
    for (local_1ac = 0;
        iVar4 = FileDescriptorProto::weak_dependency_size((FileDescriptorProto *)0x4bee0c),
        local_1ac < iVar4; local_1ac = local_1ac + 1) {
      iVar6 = FileDescriptorProto::weak_dependency
                        ((FileDescriptorProto *)in_stack_fffffffffffffad0,
                         (int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
      if ((iVar6 < 0) ||
         (iVar4 = FileDescriptorProto::dependency_size((FileDescriptorProto *)0x4bee7b),
         iVar4 <= iVar6)) {
        in_stack_fffffffffffffb50 =
             (DescriptorBuilder *)
             FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x4beed1);
        AddError(in_stack_fffffffffffffb50,
                 (string *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                 (Message *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 (ErrorLocation)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      }
      else {
        *(int32 *)(*(long *)(local_20 + 2) + (long)local_1a8 * 4) = iVar6;
        local_1a8 = local_1a8 + 1;
      }
    }
    *(int *)((long)&local_20->location_ + 0x10) = local_1a8;
    iVar4 = FileDescriptorProto::message_type_size((FileDescriptorProto *)0x4bef3f);
    *(int *)((long)&local_20->location_ + 0x14) = iVar4;
    iVar5 = FileDescriptorProto::message_type_size((FileDescriptorProto *)0x4bef67);
    AllocateArray<google::protobuf::Descriptor>
              ((DescriptorBuilder *)in_stack_fffffffffffffad0,
               (int)((ulong)in_stack_fffffffffffffac8 >> 0x20),(Descriptor **)0x4bef90);
    local_1b4 = 0;
    while (iVar24 = local_1b4,
          iVar7 = FileDescriptorProto::message_type_size((FileDescriptorProto *)0x4befb5),
          iVar24 < iVar7) {
      in_stack_fffffffffffffb38 =
           (DescriptorBuilder *)
           FileDescriptorProto::message_type
                     ((FileDescriptorProto *)in_stack_fffffffffffffad0,
                      (int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
      BuildMessage(in_stack_00000c70,in_stack_00000c68,in_stack_00000c60,in_stack_00000c58);
      local_1b4 = local_1b4 + 1;
    }
    iVar8 = FileDescriptorProto::enum_type_size((FileDescriptorProto *)0x4bf03e);
    *(int *)(local_20 + 1) = iVar8;
    iVar9 = FileDescriptorProto::enum_type_size((FileDescriptorProto *)0x4bf060);
    AllocateArray<google::protobuf::EnumDescriptor>
              ((DescriptorBuilder *)in_stack_fffffffffffffad0,
               (int)((ulong)in_stack_fffffffffffffac8 >> 0x20),(EnumDescriptor **)0x4bf083);
    local_1b8 = 0;
    while (iVar23 = local_1b8,
          iVar10 = FileDescriptorProto::enum_type_size((FileDescriptorProto *)0x4bf0a8),
          iVar23 < iVar10) {
      in_stack_fffffffffffffb20 =
           (FileDescriptorProto *)
           FileDescriptorProto::enum_type
                     ((FileDescriptorProto *)in_stack_fffffffffffffad0,
                      (int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
      BuildEnum(in_stack_00000570,in_stack_00000568,in_stack_00000560,in_stack_00000558);
      local_1b8 = local_1b8 + 1;
    }
    iVar11 = FileDescriptorProto::service_size((FileDescriptorProto *)0x4bf131);
    *(int *)((long)(local_20 + 1) + 4) = iVar11;
    FileDescriptorProto::service_size((FileDescriptorProto *)0x4bf153);
    AllocateArray<google::protobuf::ServiceDescriptor>
              ((DescriptorBuilder *)in_stack_fffffffffffffad0,
               (int)((ulong)in_stack_fffffffffffffac8 >> 0x20),(ServiceDescriptor **)0x4bf176);
    local_1bc = 0;
    while (iVar11 = local_1bc,
          iVar12 = FileDescriptorProto::service_size((FileDescriptorProto *)0x4bf19b),
          iVar11 < iVar12) {
      FileDescriptorProto::service
                ((FileDescriptorProto *)in_stack_fffffffffffffad0,
                 (int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
      BuildService((DescriptorBuilder *)CONCAT44(iVar7,iVar24),
                   (ServiceDescriptorProto *)in_stack_fffffffffffffb38,(void *)CONCAT44(iVar8,iVar9)
                   ,(ServiceDescriptor *)CONCAT44(iVar10,iVar23));
      local_1bc = local_1bc + 1;
    }
    iVar11 = FileDescriptorProto::extension_size((FileDescriptorProto *)0x4bf224);
    *(int *)((long)(local_20 + 1) + 8) = iVar11;
    FileDescriptorProto::extension_size((FileDescriptorProto *)0x4bf246);
    AllocateArray<google::protobuf::FieldDescriptor>
              ((DescriptorBuilder *)in_stack_fffffffffffffad0,
               (int)((ulong)in_stack_fffffffffffffac8 >> 0x20),(FieldDescriptor **)0x4bf269);
    local_1c0 = 0;
    while (iVar11 = local_1c0,
          iVar12 = FileDescriptorProto::extension_size((FileDescriptorProto *)0x4bf28e),
          iVar11 < iVar12) {
      FileDescriptorProto::extension
                ((FileDescriptorProto *)in_stack_fffffffffffffad0,
                 (int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
      BuildExtension((DescriptorBuilder *)in_stack_fffffffffffffae0,
                     (FieldDescriptorProto *)
                     CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                     (Descriptor *)in_stack_fffffffffffffad0,
                     (FieldDescriptor *)in_stack_fffffffffffffac8);
      local_1c0 = local_1c0 + 1;
    }
    bVar2 = FileDescriptorProto::has_options((FileDescriptorProto *)0x4bf319);
    if (bVar2) {
      FileDescriptorProto::options((FileDescriptorProto *)0x4bf34b);
      AllocateOptions((DescriptorBuilder *)CONCAT44(iVar7,iVar24),
                      (FileOptions *)in_stack_fffffffffffffb38,
                      (FileDescriptor *)CONCAT44(iVar8,iVar9));
    }
    else {
      *(undefined8 *)((long)(local_20 + 2) + 0x28) = 0;
    }
    CrossLinkFile((DescriptorBuilder *)CONCAT44(iVar8,iVar9),
                  (FileDescriptor *)CONCAT44(iVar10,iVar23),in_stack_fffffffffffffb20);
    if ((*(byte *)(in_RDI + 6) & 1) == 0) {
      OptionInterpreter::OptionInterpreter
                ((OptionInterpreter *)CONCAT44(iVar7,iVar24),in_stack_fffffffffffffb38);
      local_288[0]._M_current =
           (OptionsToInterpret *)
           std::
           vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
           ::begin((vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    *)in_stack_fffffffffffffac8);
      while( true ) {
        std::
        vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
        ::end((vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
               *)in_stack_fffffffffffffac8);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
                            *)in_stack_fffffffffffffad0,
                           (__normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
                            *)in_stack_fffffffffffffac8);
        if (!bVar2) break;
        __gnu_cxx::
        __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
        ::operator*(local_288);
        OptionInterpreter::InterpretOptions(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        __gnu_cxx::
        __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
        ::operator++(local_288);
      }
      std::
      vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ::clear((vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
               *)0x4bf46c);
      if (local_28 != (SourceCodeInfo *)0x0) {
        OptionInterpreter::UpdateSourceCodeInfo(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58)
        ;
      }
      OptionInterpreter::~OptionInterpreter((OptionInterpreter *)in_stack_fffffffffffffad0);
    }
    if (((*(byte *)(in_RDI + 6) & 1) == 0) && ((*(byte *)(*in_RDI + 0x29) & 1) == 0)) {
      ValidateFileOptions(in_stack_fffffffffffffba0,(FileDescriptor *)in_stack_fffffffffffffb98,
                          (FileDescriptorProto *)
                          CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    }
    if ((*(byte *)(in_RDI + 6) & 1) != 0) {
      local_294 = 0;
      while( true ) {
        iVar23 = (int)((ulong)in_stack_fffffffffffffac8 >> 0x20);
        iVar8 = local_294;
        iVar9 = FileDescriptorProto::message_type_size((FileDescriptorProto *)0x4bf512);
        if (iVar9 <= iVar8) break;
        this_00 = (FileDescriptorProto *)
                  FileDescriptor::message_type((FileDescriptor *)local_20,local_294);
        in_stack_fffffffffffffac8 = FileDescriptorProto::message_type(this_00,iVar23);
        DetectMapConflicts(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                           in_stack_fffffffffffffe20);
        local_294 = local_294 + 1;
      }
    }
    bVar2 = std::
            set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::empty((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *)0x4bf59f);
    if ((!bVar2) && ((*(byte *)(*in_RDI + 0x29) & 1) == 0)) {
      LogUnusedDependency(in_stack_fffffffffffffb50,(FileDescriptorProto *)CONCAT44(iVar4,iVar5),
                          (FileDescriptor *)CONCAT44(iVar7,iVar24));
    }
    if ((*(byte *)(in_RDI + 6) & 1) == 0) {
      local_8 = local_20;
    }
    else {
      local_8 = (SourceCodeInfo *)0x0;
    }
LAB_004bf617:
    local_154 = 1;
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x4bf624);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x4bf631);
  }
  else {
    FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x4be1e2);
    AddError(in_stack_fffffffffffffb50,
             (string *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
             (Message *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
             (ErrorLocation)((ulong)in_stack_fffffffffffffb38 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    local_8 = (SourceCodeInfo *)0x0;
  }
  return (FileDescriptor *)local_8;
}

Assistant:

FileDescriptor* DescriptorBuilder::BuildFileImpl(
    const FileDescriptorProto& proto) {
  FileDescriptor* result = tables_->Allocate<FileDescriptor>();
  file_ = result;

  result->is_placeholder_ = false;
  result->finished_building_ = false;
  SourceCodeInfo* info = nullptr;
  if (proto.has_source_code_info()) {
    info = tables_->AllocateMessage<SourceCodeInfo>();
    info->CopyFrom(proto.source_code_info());
    result->source_code_info_ = info;
  } else {
    result->source_code_info_ = &SourceCodeInfo::default_instance();
  }

  file_tables_ = tables_->AllocateFileTables();
  file_->tables_ = file_tables_;

  if (!proto.has_name()) {
    AddError("", proto, DescriptorPool::ErrorCollector::OTHER,
             "Missing field: FileDescriptorProto.name.");
  }

  // TODO(liujisi): Report error when the syntax is empty after all the protos
  // have added the syntax statement.
  if (proto.syntax().empty() || proto.syntax() == "proto2") {
    file_->syntax_ = FileDescriptor::SYNTAX_PROTO2;
  } else if (proto.syntax() == "proto3") {
    file_->syntax_ = FileDescriptor::SYNTAX_PROTO3;
  } else {
    file_->syntax_ = FileDescriptor::SYNTAX_UNKNOWN;
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "Unrecognized syntax: " + proto.syntax());
  }

  result->name_ = tables_->AllocateString(proto.name());
  if (proto.has_package()) {
    result->package_ = tables_->AllocateString(proto.package());
  } else {
    // We cannot rely on proto.package() returning a valid string if
    // proto.has_package() is false, because we might be running at static
    // initialization time, in which case default values have not yet been
    // initialized.
    result->package_ = tables_->AllocateString("");
  }
  result->pool_ = pool_;

  // Add to tables.
  if (!tables_->AddFile(result)) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "A file with this name is already in the pool.");
    // Bail out early so that if this is actually the exact same file, we
    // don't end up reporting that every single symbol is already defined.
    return nullptr;
  }
  if (!result->package().empty()) {
    AddPackage(result->package(), proto, result);
  }

  // Make sure all dependencies are loaded.
  std::set<std::string> seen_dependencies;
  result->dependency_count_ = proto.dependency_size();
  result->dependencies_ =
      tables_->AllocateArray<const FileDescriptor*>(proto.dependency_size());
  if (pool_->lazily_build_dependencies_) {
    result->dependencies_once_ = tables_->AllocateOnceDynamic();
    result->dependencies_names_ =
        tables_->AllocateArray<const std::string*>(proto.dependency_size());
    if (proto.dependency_size() > 0) {
      memset(result->dependencies_names_, 0,
             sizeof(*result->dependencies_names_) * proto.dependency_size());
    }
  } else {
    result->dependencies_once_ = nullptr;
    result->dependencies_names_ = nullptr;
  }
  unused_dependency_.clear();
  std::set<int> weak_deps;
  for (int i = 0; i < proto.weak_dependency_size(); ++i) {
    weak_deps.insert(proto.weak_dependency(i));
  }
  for (int i = 0; i < proto.dependency_size(); i++) {
    if (!seen_dependencies.insert(proto.dependency(i)).second) {
      AddTwiceListedError(proto, i);
    }

    const FileDescriptor* dependency = tables_->FindFile(proto.dependency(i));
    if (dependency == nullptr && pool_->underlay_ != nullptr) {
      dependency = pool_->underlay_->FindFileByName(proto.dependency(i));
    }

    if (dependency == result) {
      // Recursive import.  dependency/result is not fully initialized, and it's
      // dangerous to try to do anything with it.  The recursive import error
      // will be detected and reported in DescriptorBuilder::BuildFile().
      return nullptr;
    }

    if (dependency == nullptr) {
      if (!pool_->lazily_build_dependencies_) {
        if (pool_->allow_unknown_ ||
            (!pool_->enforce_weak_ && weak_deps.find(i) != weak_deps.end())) {
          dependency =
              pool_->NewPlaceholderFileWithMutexHeld(proto.dependency(i));
        } else {
          AddImportError(proto, i);
        }
      }
    } else {
      // Add to unused_dependency_ to track unused imported files.
      // Note: do not track unused imported files for public import.
      if (pool_->enforce_dependencies_ &&
          (pool_->unused_import_track_files_.find(proto.name()) !=
           pool_->unused_import_track_files_.end()) &&
          (dependency->public_dependency_count() == 0)) {
        unused_dependency_.insert(dependency);
      }
    }

    result->dependencies_[i] = dependency;
    if (pool_->lazily_build_dependencies_ && !dependency) {
      result->dependencies_names_[i] =
          tables_->AllocateString(proto.dependency(i));
    }
  }

  // Check public dependencies.
  int public_dependency_count = 0;
  result->public_dependencies_ =
      tables_->AllocateArray<int>(proto.public_dependency_size());
  for (int i = 0; i < proto.public_dependency_size(); i++) {
    // Only put valid public dependency indexes.
    int index = proto.public_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->public_dependencies_[public_dependency_count++] = index;
      // Do not track unused imported files for public import.
      // Calling dependency(i) builds that file when doing lazy imports,
      // need to avoid doing this. Unused dependency detection isn't done
      // when building lazily, anyways.
      if (!pool_->lazily_build_dependencies_) {
        unused_dependency_.erase(result->dependency(index));
      }
    } else {
      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               "Invalid public dependency index.");
    }
  }
  result->public_dependency_count_ = public_dependency_count;

  // Build dependency set
  dependencies_.clear();
  // We don't/can't do proper dependency error checking when
  // lazily_build_dependencies_, and calling dependency(i) will force
  // a dependency to be built, which we don't want.
  if (!pool_->lazily_build_dependencies_) {
    for (int i = 0; i < result->dependency_count(); i++) {
      RecordPublicDependencies(result->dependency(i));
    }
  }

  // Check weak dependencies.
  int weak_dependency_count = 0;
  result->weak_dependencies_ =
      tables_->AllocateArray<int>(proto.weak_dependency_size());
  for (int i = 0; i < proto.weak_dependency_size(); i++) {
    int index = proto.weak_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->weak_dependencies_[weak_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               "Invalid weak dependency index.");
    }
  }
  result->weak_dependency_count_ = weak_dependency_count;

  // Convert children.
  BUILD_ARRAY(proto, result, message_type, BuildMessage, nullptr);
  BUILD_ARRAY(proto, result, enum_type, BuildEnum, nullptr);
  BUILD_ARRAY(proto, result, service, BuildService, nullptr);
  BUILD_ARRAY(proto, result, extension, BuildExtension, nullptr);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = nullptr;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  // Note that the following steps must occur in exactly the specified order.

  // Cross-link.
  CrossLinkFile(result, proto);

  // Interpret any remaining uninterpreted options gathered into
  // options_to_interpret_ during descriptor building.  Cross-linking has made
  // extension options known, so all interpretations should now succeed.
  if (!had_errors_) {
    OptionInterpreter option_interpreter(this);
    for (std::vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretOptions(&(*iter));
    }
    options_to_interpret_.clear();
    if (info != nullptr) {
      option_interpreter.UpdateSourceCodeInfo(info);
    }
  }

  // Validate options. See comments at InternalSetLazilyBuildDependencies about
  // error checking and lazy import building.
  if (!had_errors_ && !pool_->lazily_build_dependencies_) {
    ValidateFileOptions(result, proto);
  }

  // Additional naming conflict check for map entry types. Only need to check
  // this if there are already errors.
  if (had_errors_) {
    for (int i = 0; i < proto.message_type_size(); ++i) {
      DetectMapConflicts(result->message_type(i), proto.message_type(i));
    }
  }


  // Again, see comments at InternalSetLazilyBuildDependencies about error
  // checking.
  if (!unused_dependency_.empty() && !pool_->lazily_build_dependencies_) {
    LogUnusedDependency(proto, result);
  }

  if (had_errors_) {
    return nullptr;
  } else {
    return result;
  }
}